

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moveGeneration.cpp
# Opt level: O0

U64 getNegativeRayAttacks(U64 occupied,U64 friendly,int direction,int square)

{
  int iVar1;
  U64 blocker;
  U64 attacks;
  int square_local;
  int direction_local;
  U64 friendly_local;
  U64 occupied_local;
  
  blocker = RayTable[square][direction];
  if ((blocker & occupied) != 0) {
    iVar1 = bitScan(blocker & occupied);
    blocker = RayTable[iVar1][direction] ^ blocker;
  }
  return (friendly ^ 0xffffffffffffffff) & blocker;
}

Assistant:

U64 getNegativeRayAttacks(U64 occupied, U64 friendly, int direction, int square) {
  U64 attacks = RayTable[square][direction];
  U64 blocker = attacks & occupied;
  if(blocker) {
    square = bitScan(blocker);
    attacks ^= RayTable[square][direction];
  }
  attacks &= ~friendly;
  return attacks;
}